

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O1

bool __thiscall cmQtAutoGenerators::StartsWith(cmQtAutoGenerators *this,string *str,string *with)

{
  int iVar1;
  bool bVar2;
  long *local_38;
  size_t local_30;
  long local_28 [2];
  
  bVar2 = false;
  std::__cxx11::string::substr((ulong)&local_38,(ulong)str);
  if (local_30 == with->_M_string_length) {
    if (local_30 == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(local_38,(with->_M_dataplus)._M_p,local_30);
      bVar2 = iVar1 == 0;
    }
  }
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return bVar2;
}

Assistant:

bool cmQtAutoGenerators::StartsWith(const std::string& str,
                                    const std::string& with)
{
  return (str.substr(0, with.length()) == with);
}